

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_client.cpp
# Opt level: O0

int __thiscall miniros::ServiceClient::Impl::shutdown(Impl *this,int __fd,int __how)

{
  bool bVar1;
  undefined7 extraout_var;
  element_type *this_00;
  Impl *extraout_RAX;
  __shared_ptr<miniros::ServiceServerLink,_(__gnu_cxx::_Lock_policy)2> *unaff_retaddr;
  DropReason in_stack_000000ac;
  Connection *in_stack_000000b0;
  
  if ((this->is_shutdown_ & 1U) == 0) {
    if ((this->persistent_ & 1U) == 0) {
      this->is_shutdown_ = true;
    }
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this);
    this = (Impl *)CONCAT71(extraout_var,bVar1);
    if (bVar1) {
      this_00 = std::
                __shared_ptr_access<miniros::ServiceServerLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<miniros::ServiceServerLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x4a373d);
      ServiceServerLink::getConnection(this_00);
      std::__shared_ptr_access<miniros::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<miniros::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x4a374d);
      Connection::drop(in_stack_000000b0,in_stack_000000ac);
      std::__shared_ptr<miniros::ServiceServerLink,_(__gnu_cxx::_Lock_policy)2>::reset
                (unaff_retaddr);
      this = extraout_RAX;
    }
  }
  return (int)this;
}

Assistant:

void ServiceClient::Impl::shutdown()
{
  if (!is_shutdown_)
  {
    if (!persistent_)
    {
      is_shutdown_ = true;
    }

    if (server_link_)
    {
      server_link_->getConnection()->drop(Connection::Destructing);
      server_link_.reset();
    }
  }
}